

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicRectMatrix.hpp
# Opt level: O1

DynamicRectMatrix<double> __thiscall
OpenMD::DynamicRectMatrix<double>::operator=
          (DynamicRectMatrix<double> *this,DynamicRectMatrix<double> *m)

{
  uint uVar1;
  uint uVar2;
  double **ppdVar3;
  double **ppdVar4;
  double *pdVar5;
  double *pdVar6;
  DynamicRectMatrix<double> *in_RDX;
  undefined8 extraout_RDX;
  ulong uVar7;
  ulong uVar8;
  DynamicRectMatrix<double> DVar9;
  
  if (m != in_RDX) {
    if ((m->nrow_ != in_RDX->nrow_) || (m->ncol_ != in_RDX->ncol_)) {
      deallocate(m);
      allocate(m,in_RDX->nrow_,in_RDX->ncol_);
    }
    uVar1 = m->nrow_;
    if ((ulong)uVar1 != 0) {
      uVar2 = m->ncol_;
      ppdVar3 = in_RDX->data_;
      ppdVar4 = m->data_;
      uVar7 = 0;
      do {
        if ((ulong)uVar2 != 0) {
          pdVar5 = ppdVar3[uVar7];
          pdVar6 = ppdVar4[uVar7];
          uVar8 = 0;
          do {
            pdVar6[uVar8] = pdVar5[uVar8];
            uVar8 = uVar8 + 1;
          } while (uVar2 != uVar8);
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 != uVar1);
    }
  }
  DynamicRectMatrix(this,m);
  DVar9.nrow_ = (int)extraout_RDX;
  DVar9.ncol_ = (int)((ulong)extraout_RDX >> 0x20);
  DVar9.data_ = (double **)this;
  return DVar9;
}

Assistant:

DynamicRectMatrix<Real> operator=(const DynamicRectMatrix<Real>& m) {
      if (this == &m) return *this;
      if (nrow_ != m.getNRow() || ncol_ != m.getNCol()) {
        deallocate();
        allocate(m.getNRow(), m.getNCol());
      }

      for (unsigned int i = 0; i < nrow_; i++)
        for (unsigned int j = 0; j < ncol_; j++)
          this->data_[i][j] = m.data_[i][j];
      return *this;
    }